

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void icu_63::cloneUnicodeString(UElement *dst,UElement *src)

{
  UnicodeString *this;
  undefined8 local_38;
  UElement *src_local;
  UElement *dst_local;
  
  this = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)src);
  local_38 = (UnicodeString *)0x0;
  if (this != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(this,(UnicodeString *)src->pointer);
    local_38 = this;
  }
  dst->pointer = local_38;
  return;
}

Assistant:

static void U_CALLCONV cloneUnicodeString(UElement *dst, UElement *src) {
    dst->pointer = new UnicodeString(*(UnicodeString*)src->pointer);
}